

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_storage.cpp
# Opt level: O1

void __thiscall
libtorrent::dht::anon_unknown_0::dht_default_storage::put_immutable_item
          (dht_default_storage *this,sha1_hash *target,span<const_char> buf,address *addr)

{
  _Rb_tree_header *p_Var1;
  int32_t *piVar2;
  size_t *psVar3;
  uint uVar4;
  _Base_ptr p_Var5;
  size_t sVar6;
  _Base_ptr p_Var7;
  bool bVar8;
  int iVar9;
  int iVar10;
  _Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>_>
  *this_00;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree_node_base *p_Var12;
  uint uVar13;
  char *pcVar14;
  vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *ids;
  long lVar15;
  _Rb_tree_node_base *p_Var16;
  byte bVar17;
  _Link_type p_Var19;
  uint uVar20;
  byte in_R10B;
  uint uVar21;
  _Rb_tree_node_base *p_Var22;
  undefined1 auVar23 [16];
  span<const_char> buf_00;
  dht_immutable_item to_add;
  _Base_ptr local_c8;
  sha1_hash *psVar18;
  
  p_Var1 = &(this->m_immutable_table)._M_t._M_impl.super__Rb_tree_header;
  p_Var22 = (this->m_immutable_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var11 = &p_Var1->_M_header;
  psVar18 = target;
  for (; p_Var22 != (_Rb_tree_node_base *)0x0;
      p_Var22 = *(_Rb_tree_node_base **)((long)&p_Var22->_M_color + lVar15)) {
    lVar15 = 0x20;
    do {
      uVar13 = *(uint *)((long)&p_Var22->_M_color + lVar15);
      uVar20 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
      uVar4 = *(uint *)((long)(target->m_number)._M_elems + lVar15 + -0x20);
      uVar21 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      in_R10B = uVar20 < uVar21;
      bVar17 = (byte)psVar18 & uVar20 <= uVar21 | in_R10B;
      psVar18 = (sha1_hash *)(ulong)bVar17;
      if (uVar13 != uVar4) {
        lVar15 = (ulong)bVar17 * 8 + 0x10;
        if (bVar17 == 0) {
          p_Var11 = p_Var22;
        }
        goto LAB_003b7dc8;
      }
      lVar15 = lVar15 + 4;
    } while (lVar15 != 0x34);
    lVar15 = 0x10;
    p_Var11 = p_Var22;
LAB_003b7dc8:
    psVar18 = (sha1_hash *)(ulong)bVar17;
  }
  p_Var22 = &p_Var1->_M_header;
  if ((_Rb_tree_header *)p_Var11 != p_Var1) {
    lVar15 = 0x20;
    do {
      uVar13 = *(uint *)((long)(target->m_number)._M_elems + lVar15 + -0x20);
      uVar20 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
      uVar4 = *(uint *)((long)&p_Var11->_M_color + lVar15);
      uVar21 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      in_R10B = in_R10B & uVar20 <= uVar21 | uVar20 < uVar21;
      if (uVar13 != uVar4) {
        if (in_R10B != 0) goto LAB_003b7e1f;
        break;
      }
      lVar15 = lVar15 + 4;
    } while (lVar15 != 0x34);
    p_Var22 = p_Var11;
  }
LAB_003b7e1f:
  if ((_Rb_tree_header *)p_Var22 != p_Var1) goto LAB_003b80f7;
  sVar6 = (this->m_immutable_table)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pcVar14 = (char *)buf.m_len;
  iVar9 = (*this->m_settings->_vptr_settings_interface[5])();
  if (iVar9 <= (int)sVar6) {
    p_Var22 = (this->m_immutable_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (((_Rb_tree_header *)p_Var22 != p_Var1) &&
       (auVar23 = ::std::_Rb_tree_increment(p_Var22), (_Rb_tree_header *)auVar23._0_8_ != p_Var1)) {
      do {
        p_Var11 = auVar23._0_8_;
        iVar9 = min_distance_exp((dht *)(p_Var11 + 1),(node_id *)&this->m_node_ids,auVar23._8_8_);
        iVar10 = min_distance_exp((dht *)(p_Var22 + 1),(node_id *)&this->m_node_ids,ids);
        uVar13 = *(int *)&p_Var11[6]._M_parent / 5 - iVar9;
        pcVar14 = (char *)(ulong)uVar13;
        if ((int)uVar13 < *(int *)&p_Var22[6]._M_parent / 5 - iVar10) {
          p_Var22 = p_Var11;
        }
        auVar23 = ::std::_Rb_tree_increment(p_Var11);
      } while ((_Rb_tree_header *)auVar23._0_8_ != p_Var1);
    }
    p_Var19 = (_Link_type)p_Var1;
    this_00 = (_Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>_>
               *)::std::_Rb_tree_rebalance_for_erase(p_Var22,&p_Var1->_M_header);
    ::std::
    _Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>_>
    ::_M_drop_node(this_00,p_Var19);
    psVar3 = &(this->m_immutable_table)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar3 = *psVar3 - 1;
    piVar2 = &(this->m_counters).immutable_data;
    *piVar2 = *piVar2 + -1;
  }
  memset((anon_unknown_0 *)&local_c8,0,0x98);
  buf_00.m_len = (difference_type)pcVar14;
  buf_00.m_ptr = (char *)buf.m_len;
  set_value((anon_unknown_0 *)&local_c8,(dht_immutable_item *)buf.m_ptr,buf_00);
  p_Var7 = local_c8;
  uVar13 = (target->m_number)._M_elems[4];
  uVar4 = (target->m_number)._M_elems[0];
  uVar20 = (target->m_number)._M_elems[1];
  p_Var5 = *(_Base_ptr *)((target->m_number)._M_elems + 2);
  local_c8 = (_Base_ptr)0x0;
  p_Var11 = (_Rb_tree_node_base *)operator_new(0xd0);
  p_Var19 = (_Link_type)&stack0xffffffffffffff40;
  *(uint *)&p_Var11[1]._M_left = uVar13;
  p_Var11[1]._M_color = uVar4;
  *(uint *)&p_Var11[1].field_0x4 = uVar20;
  p_Var11[1]._M_parent = p_Var5;
  p_Var11[1]._M_right = p_Var7;
  memcpy(p_Var11 + 2,p_Var19,0x90);
  p_Var22 = (this->m_immutable_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var22 == (_Rb_tree_node_base *)0x0) {
    pcVar14 = (char *)0x1;
    p_Var16 = &p_Var1->_M_header;
  }
  else {
    do {
      p_Var16 = p_Var22;
      lVar15 = 0x20;
      do {
        uVar13 = *(uint *)((long)&p_Var11->_M_color + lVar15);
        uVar20 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18
        ;
        uVar4 = *(uint *)((long)&p_Var16->_M_color + lVar15);
        uVar21 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        p_Var19 = (_Link_type)(ulong)CONCAT31((int3)(uVar20 >> 8),uVar20 <= uVar21);
        pcVar14 = (char *)(ulong)(byte)((byte)pcVar14 & uVar20 <= uVar21 | uVar20 < uVar21);
        if (uVar13 != uVar4) goto LAB_003b7ff5;
        lVar15 = lVar15 + 4;
      } while (lVar15 != 0x34);
      pcVar14 = (char *)0x0;
LAB_003b7ff5:
      p_Var22 = (&p_Var16->_M_left)[(byte)((byte)pcVar14 ^ 1)];
    } while (p_Var22 != (_Base_ptr)0x0);
  }
  p_Var12 = p_Var16;
  if ((char)pcVar14 == '\0') {
LAB_003b8026:
    lVar15 = 0x20;
    do {
      uVar13 = *(uint *)((long)&p_Var12->_M_color + lVar15);
      p_Var19 = (_Link_type)(ulong)uVar13;
      uVar20 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
      uVar4 = *(uint *)((long)&p_Var11->_M_color + lVar15);
      uVar21 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      bVar17 = (byte)pcVar14 & uVar20 <= uVar21 | uVar20 < uVar21;
      pcVar14 = (char *)(ulong)bVar17;
      if (uVar13 != uVar4) goto LAB_003b805e;
      lVar15 = lVar15 + 4;
    } while (lVar15 != 0x34);
    bVar17 = 0;
LAB_003b805e:
    if (bVar17 == 0) {
      p_Var16 = (_Rb_tree_node_base *)0x0;
      p_Var22 = p_Var12;
    }
  }
  else if (p_Var16 != (this->m_immutable_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
          ) {
    p_Var12 = (_Rb_tree_node_base *)::std::_Rb_tree_decrement(p_Var16);
    goto LAB_003b8026;
  }
  if (p_Var16 == (_Rb_tree_node_base *)0x0) {
    ::std::
    _Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>_>
    ::_M_drop_node((_Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>_>
                    *)p_Var11,p_Var19);
  }
  else {
    bVar8 = true;
    if ((p_Var22 == (_Rb_tree_node_base *)0x0) && (p_Var1 != (_Rb_tree_header *)p_Var16)) {
      lVar15 = 0;
      do {
        uVar13 = *(uint *)((long)&p_Var11[1]._M_color + lVar15);
        uVar20 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18
        ;
        uVar4 = *(uint *)((long)&p_Var16[1]._M_color + lVar15);
        uVar21 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        bVar8 = (bool)(bVar8 & uVar20 <= uVar21 | uVar20 < uVar21);
        if (uVar13 != uVar4) goto LAB_003b80d0;
        lVar15 = lVar15 + 4;
      } while (lVar15 != 0x14);
      bVar8 = false;
    }
LAB_003b80d0:
    ::std::_Rb_tree_insert_and_rebalance(bVar8,p_Var11,p_Var16,&p_Var1->_M_header);
    psVar3 = &(this->m_immutable_table)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar3 = *psVar3 + 1;
    p_Var22 = p_Var11;
  }
  piVar2 = &(this->m_counters).immutable_data;
  *piVar2 = *piVar2 + 1;
  if (local_c8 != (_Base_ptr)0x0) {
    operator_delete__(local_c8);
  }
LAB_003b80f7:
  touch_item((dht_immutable_item *)&p_Var22[1]._M_right,addr);
  return;
}

Assistant:

void put_immutable_item(sha1_hash const& target
			, span<char const> buf
			, address const& addr) override
		{
			TORRENT_ASSERT(!m_node_ids.empty());
			auto i = m_immutable_table.find(target);
			if (i == m_immutable_table.end())
			{
				// make sure we don't add too many items
				if (int(m_immutable_table.size()) >= m_settings.get_int(settings_pack::dht_max_dht_items))
				{
					auto const j = pick_least_important_item(m_node_ids
						, m_immutable_table);

					TORRENT_ASSERT(j != m_immutable_table.end());
					m_immutable_table.erase(j);
					m_counters.immutable_data -= 1;
				}
				dht_immutable_item to_add;
				set_value(to_add, buf);

				std::tie(i, std::ignore) = m_immutable_table.insert(
					std::make_pair(target, std::move(to_add)));
				m_counters.immutable_data += 1;
			}

//			std::fprintf(stderr, "added immutable item (%d)\n", int(m_immutable_table.size()));

			touch_item(i->second, addr);
		}